

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O0

uint aom_sad_skip_128x128_avx2(uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride)

{
  uint uVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  uint32_t sum;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar1 = aom_sad128x64_avx2((uint8_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                             (int)((ulong)in_RDX >> 0x20),
                             (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                             in_stack_ffffffffffffffdc);
  return uVar1 << 1;
}

Assistant:

unsigned int aom_sad_skip_128x128_avx2(const uint8_t *src_ptr, int src_stride,
                                       const uint8_t *ref_ptr, int ref_stride) {
  const uint32_t sum =
      aom_sad128x64_avx2(src_ptr, 2 * src_stride, ref_ptr, 2 * ref_stride);
  return 2 * sum;
}